

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

int32_t __thiscall fasttext::FastText::getLabelId(FastText *this,string *label)

{
  int32_t iVar1;
  int32_t iVar2;
  element_type *this_00;
  Dictionary *in_RSI;
  int32_t labelId;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b3941);
  iVar1 = Dictionary::getId(in_RSI,(string *)
                                   CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (iVar1 != -1) {
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b3967);
    iVar2 = Dictionary::nwords(this_00);
    iVar1 = iVar1 - iVar2;
  }
  return iVar1;
}

Assistant:

int32_t FastText::getLabelId(const std::string& label) const {
  int32_t labelId = dict_->getId(label);
  if (labelId != -1) {
    labelId -= dict_->nwords();
  }
  return labelId;
}